

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_tensor(ggml_context *ctx,char *name)

{
  long lVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  char *in_RSI;
  long in_RDI;
  ggml_tensor *cur;
  char *mem_buffer;
  ggml_object *obj;
  long *local_20;
  
  local_20 = *(long **)(in_RDI + 0x18);
  lVar1 = *(long *)(in_RDI + 8);
  do {
    if (local_20 == (long *)0x0) {
      return (ggml_tensor *)0x0;
    }
    if ((int)local_20[3] == 0) {
      pgVar3 = (ggml_tensor *)(lVar1 + *local_20);
      iVar2 = strcmp(pgVar3->name,in_RSI);
      if (iVar2 == 0) {
        return pgVar3;
      }
    }
    local_20 = (long *)local_20[2];
  } while( true );
}

Assistant:

struct ggml_tensor * ggml_get_tensor(struct ggml_context * ctx, const char * name) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            struct ggml_tensor * cur = (struct ggml_tensor *)(mem_buffer + obj->offs);
            if (strcmp(cur->name, name) == 0) {
                return cur;
            }
        }

        obj = obj->next;
    }

    return NULL;
}